

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

uint Extra_TruthCanonNPN(uint uTruth,int nVars)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int local_2c;
  int local_28;
  int i;
  int k;
  int nMints;
  uint uPerm;
  uint uPhase;
  uint uTruthC;
  uint uTruthMin;
  int nVars_local;
  uint uTruth_local;
  
  if (Extra_TruthCanonNPN::pPerms == (char **)0x0) {
    Extra_TruthCanonNPN::nPerms = Extra_Factorial(nVars);
    Extra_TruthCanonNPN::pPerms = Extra_Permutations(nVars);
    Extra_TruthCanonNPN::nVarsOld = nVars;
  }
  else if (Extra_TruthCanonNPN::nVarsOld != nVars) {
    if (Extra_TruthCanonNPN::pPerms != (char **)0x0) {
      free(Extra_TruthCanonNPN::pPerms);
      Extra_TruthCanonNPN::pPerms = (char **)0x0;
    }
    Extra_TruthCanonNPN::nPerms = Extra_Factorial(nVars);
    Extra_TruthCanonNPN::pPerms = Extra_Permutations(nVars);
    Extra_TruthCanonNPN::nVarsOld = nVars;
  }
  iVar1 = 1 << ((byte)nVars & 0x1f);
  uPhase = 0xffffffff;
  for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
    uVar2 = Extra_TruthPolarize(uTruth,local_2c,nVars);
    for (local_28 = 0; local_28 < Extra_TruthCanonNPN::nPerms; local_28 = local_28 + 1) {
      uVar3 = Extra_TruthPermute(uVar2,Extra_TruthCanonNPN::pPerms[local_28],nVars,0);
      if (uVar3 < uPhase) {
        uPhase = uVar3;
      }
    }
    uVar2 = Extra_TruthPolarize((uTruth ^ 0xffffffff) & 0xffffffffU >> (0x20U - (char)iVar1 & 0x1f),
                                local_2c,nVars);
    for (local_28 = 0; local_28 < Extra_TruthCanonNPN::nPerms; local_28 = local_28 + 1) {
      uVar3 = Extra_TruthPermute(uVar2,Extra_TruthCanonNPN::pPerms[local_28],nVars,0);
      if (uVar3 < uPhase) {
        uPhase = uVar3;
      }
    }
  }
  return uPhase;
}

Assistant:

unsigned Extra_TruthCanonNPN( unsigned uTruth, int nVars )
{
    static int nVarsOld, nPerms;
    static char ** pPerms = NULL;

    unsigned uTruthMin, uTruthC, uPhase, uPerm;
    int nMints, k, i;

    if ( pPerms == NULL )
    {
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }
    else if ( nVarsOld != nVars )
    {
        ABC_FREE( pPerms );
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }

    nMints    = (1 << nVars);
    uTruthC   = (unsigned)( (~uTruth) & ((~((unsigned)0)) >> (32-nMints)) );
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        for ( k = 0; k < nPerms; k++ )
        {
            uPerm = Extra_TruthPermute( uPhase, pPerms[k], nVars, 0 );
            if ( uTruthMin > uPerm )
                uTruthMin = uPerm;
        }
        uPhase = Extra_TruthPolarize( uTruthC, i, nVars ); 
        for ( k = 0; k < nPerms; k++ )
        {
            uPerm = Extra_TruthPermute( uPhase, pPerms[k], nVars, 0 );
            if ( uTruthMin > uPerm )
                uTruthMin = uPerm;
        }
    }
    return uTruthMin;
}